

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmNinjaTargetGenerator::CompileWithDefines(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  string *local_18;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_18 = lang;
  lang_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_68,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_98,local_18);
  cmStrCat<char[22]>(&local_38,&local_68,&local_98,(char (*) [22])"_COMPILE_WITH_DEFINES");
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmNinjaTargetGenerator::CompileWithDefines(std::string const& lang) const
{
  return this->Makefile->IsOn(
    cmStrCat("CMAKE_", lang, "_COMPILE_WITH_DEFINES"));
}